

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_crypto.c
# Opt level: O0

psa_status_t psa_validate_optional_attributes(psa_key_slot_t *slot,psa_key_attributes_t *attributes)

{
  int iVar1;
  psa_status_t pVar2;
  int local_54;
  undefined1 local_50 [4];
  int ret;
  mbedtls_mpi required;
  mbedtls_mpi actual;
  psa_key_attributes_t *attributes_local;
  psa_key_slot_t *slot_local;
  
  if (((attributes->core).type != 0) && ((attributes->core).type != (slot->attr).type)) {
    return -0x87;
  }
  if (attributes->domain_parameters_size != 0) {
    if (((slot->attr).type & 0xcfff) != 0x4001) {
      return -0x87;
    }
    mbedtls_mpi_init((mbedtls_mpi *)&required.p);
    mbedtls_mpi_init((mbedtls_mpi *)local_50);
    local_54 = mbedtls_rsa_export((slot->data).rsa,(mbedtls_mpi *)0x0,(mbedtls_mpi *)0x0,
                                  (mbedtls_mpi *)0x0,(mbedtls_mpi *)0x0,(mbedtls_mpi *)&required.p);
    if (((local_54 == 0) &&
        (local_54 = mbedtls_mpi_read_binary
                              ((mbedtls_mpi *)local_50,(uchar *)attributes->domain_parameters,
                               attributes->domain_parameters_size), local_54 == 0)) &&
       (iVar1 = mbedtls_mpi_cmp_mpi((mbedtls_mpi *)&required.p,(mbedtls_mpi *)local_50), iVar1 != 0)
       ) {
      local_54 = -0x4080;
    }
    mbedtls_mpi_free((mbedtls_mpi *)&required.p);
    mbedtls_mpi_free((mbedtls_mpi *)local_50);
    if (local_54 != 0) {
      pVar2 = mbedtls_to_psa_error(local_54);
      return pVar2;
    }
  }
  if (((attributes->core).bits == 0) || ((attributes->core).bits == (slot->attr).bits)) {
    slot_local._4_4_ = 0;
  }
  else {
    slot_local._4_4_ = -0x87;
  }
  return slot_local._4_4_;
}

Assistant:

static psa_status_t psa_validate_optional_attributes(
    const psa_key_slot_t *slot,
    const psa_key_attributes_t *attributes )
{
    if( attributes->core.type != 0 )
    {
        if( attributes->core.type != slot->attr.type )
            return( PSA_ERROR_INVALID_ARGUMENT );
    }

    if( attributes->domain_parameters_size != 0 )
    {
#if defined(MBEDTLS_RSA_C)
        if( PSA_KEY_TYPE_IS_RSA( slot->attr.type ) )
        {
            mbedtls_mpi actual, required;
            int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
            mbedtls_mpi_init( &actual );
            mbedtls_mpi_init( &required );
            ret = mbedtls_rsa_export( slot->data.rsa,
                                      NULL, NULL, NULL, NULL, &actual );
            if( ret != 0 )
                goto rsa_exit;
            ret = mbedtls_mpi_read_binary( &required,
                                           attributes->domain_parameters,
                                           attributes->domain_parameters_size );
            if( ret != 0 )
                goto rsa_exit;
            if( mbedtls_mpi_cmp_mpi( &actual, &required ) != 0 )
                ret = MBEDTLS_ERR_RSA_BAD_INPUT_DATA;
        rsa_exit:
            mbedtls_mpi_free( &actual );
            mbedtls_mpi_free( &required );
            if( ret != 0)
                return( mbedtls_to_psa_error( ret ) );
        }
        else
#endif
        {
            return( PSA_ERROR_INVALID_ARGUMENT );
        }
    }

    if( attributes->core.bits != 0 )
    {
        if( attributes->core.bits != slot->attr.bits )
            return( PSA_ERROR_INVALID_ARGUMENT );
    }

    return( PSA_SUCCESS );
}